

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O2

void __thiscall lsim::ModelWire::split_at_new_junction(ModelWire *this,Point *p)

{
  ModelWireSegment *segment;
  bool bVar1;
  ModelWireJunction *pMVar2;
  long lVar3;
  long lVar4;
  __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
  _Var5;
  __normal_iterator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_*,_std::vector<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>_>
  __it;
  Point p_end;
  Point local_40;
  unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_> *local_38;
  
  bVar1 = point_is_junction(this,p);
  if (bVar1) {
    return;
  }
  __it._M_current =
       (this->m_segments).
       super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_segments).
             super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = *p;
  lVar3 = (long)local_38 - (long)__it._M_current;
  for (lVar4 = lVar3 >> 5; _Var5._M_current = __it._M_current, 0 < lVar4; lVar4 = lVar4 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::$_0>::operator()
                      ((_Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0>
                        *)&local_40,__it);
    if (bVar1) goto LAB_0015ffa9;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::$_0>::operator()
                      ((_Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0>
                        *)&local_40,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_0015ffa9;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::$_0>::operator()
                      ((_Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0>
                        *)&local_40,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_0015ffa9;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::$_0>::operator()
                      ((_Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0>
                        *)&local_40,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_0015ffa9;
    __it._M_current = __it._M_current + 4;
    lVar3 = lVar3 + -0x20;
  }
  lVar3 = lVar3 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var5._M_current = local_38;
      if ((lVar3 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::$_0>::
                  operator()((_Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0>
                              *)&local_40,__it), _Var5._M_current = __it._M_current, bVar1))
      goto LAB_0015ffa9;
      _Var5._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::$_0>::operator()
                      ((_Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0>
                        *)&local_40,_Var5);
    if (bVar1) goto LAB_0015ffa9;
    __it._M_current = _Var5._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::$_0>::operator()
                    ((_Iter_pred<lsim::ModelWire::split_at_new_junction(lsim::Point_const&)::__0> *)
                     &local_40,__it);
  _Var5._M_current = local_38;
  if (bVar1) {
    _Var5._M_current = __it._M_current;
  }
LAB_0015ffa9:
  if (_Var5._M_current !=
      (this->m_segments).
      super__Vector_base<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>,_std::allocator<std::unique_ptr<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    segment = ((_Var5._M_current)->_M_t).
              super___uniq_ptr_impl<lsim::ModelWireSegment,_std::default_delete<lsim::ModelWireSegment>_>
              ._M_t.
              super__Tuple_impl<0UL,_lsim::ModelWireSegment_*,_std::default_delete<lsim::ModelWireSegment>_>
              .super__Head_base<0UL,_lsim::ModelWireSegment_*,_false>._M_head_impl;
    pMVar2 = *(ModelWireJunction **)((long)(segment->m_ends)._M_elems + 8);
    local_40 = pMVar2->m_position;
    ModelWireJunction::remove_segment(pMVar2,segment);
    pMVar2 = create_new_junction(this,p,segment);
    *(ModelWireJunction **)((long)(segment->m_ends)._M_elems + 8) = pMVar2;
    add_segment(this,p,&local_40);
  }
  return;
}

Assistant:

void ModelWire::split_at_new_junction(const Point &p) {
    // nothing to do if there is already a junction at the specified point
    if (point_is_junction(p)) {
        return;
    }

    // find segment containing the point
    auto found = std::find_if(m_segments.begin(), m_segments.end(), 
                                [p](const auto &s) {return s->point_on_segment(p);});
    if (found == m_segments.end()) {
        return;
    }
    auto segment = found->get();
	
	auto p_end = segment->junction(1)->position();
	segment->junction(1)->remove_segment(segment);
	segment->set_junction(1, create_new_junction(p, segment));
	add_segment(p, p_end);
}